

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

int __thiscall raspicam::_private::Private_Impl_Still::initialize(Private_Impl_Still *this)

{
  MMAL_PORT_T *output_port;
  MMAL_PORT_T *input_port;
  int iVar1;
  MMAL_STATUS_T MVar2;
  ostream *poVar3;
  char *pcVar4;
  Private_Impl_Still *this_00;
  
  if (this->_isInitialized != false) {
    return 0;
  }
  iVar1 = createCamera(this);
  if (iVar1 == 0) {
    this_00 = this;
    iVar1 = createEncoder(this);
    if (iVar1 == 0) {
      output_port = this->camera->output[2];
      this->camera_still_port = output_port;
      input_port = *this->encoder->input;
      this->encoder_input_port = input_port;
      this->encoder_output_port = *this->encoder->output;
      MVar2 = connectPorts(this_00,output_port,input_port,&this->encoder_connection);
      if (MVar2 != MMAL_SUCCESS) {
        std::operator<<((ostream *)&std::cout,"ERROR: Could not connect encoder ports!\n");
        return -1;
      }
      this->_isInitialized = true;
      return 0;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,this->API_NAME);
    pcVar4 = ": Failed to create encoder component.\n";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,this->API_NAME);
    pcVar4 = ": Failed to create camera component.\n";
  }
  std::operator<<(poVar3,pcVar4);
  destroyCamera(this);
  return -1;
}

Assistant:

int Private_Impl_Still::initialize() {
            if ( _isInitialized ) return 0;
            if ( createCamera() ) {
                cout << API_NAME << ": Failed to create camera component.\n";
                destroyCamera();
                return -1;
            } else if ( createEncoder() ) {
                cout << API_NAME << ": Failed to create encoder component.\n";
                destroyCamera();
                return -1;
            } else {
                camera_still_port	= camera->output[MMAL_CAMERA_CAPTURE_PORT];
                encoder_input_port  = encoder->input[0];
                encoder_output_port = encoder->output[0];
                if ( connectPorts ( camera_still_port, encoder_input_port, &encoder_connection ) != MMAL_SUCCESS ) {
                    cout << "ERROR: Could not connect encoder ports!\n";
                    return -1;
                }
            }
            _isInitialized=true;
            return 0;
        }